

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O1

idx_t duckdb::ListSearchSimpleOp<unsigned_long,true>
                (Vector *list_vec,Vector *source_vec,Vector *target_vec,Vector *result,idx_t count)

{
  anon_class_24_3_a294625c fun;
  idx_t iVar1;
  idx_t total_matches;
  unsigned_long *source_data;
  UnifiedVectorFormat source_format;
  idx_t local_a0;
  UnifiedVectorFormat *local_98;
  data_ptr_t *ppdStack_90;
  idx_t *local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  iVar1 = ListVector::GetListSize(list_vec);
  Vector::ToUnifiedFormat(source_vec,iVar1,&local_78);
  ppdStack_90 = &local_80;
  local_80 = local_78.data;
  local_88 = &local_a0;
  local_a0 = 0;
  fun.source_data = (unsigned_long **)ppdStack_90;
  fun.source_format = &local_78;
  fun.total_matches = local_88;
  local_98 = &local_78;
  BinaryExecutor::
  ExecuteSwitch<duckdb::list_entry_t,unsigned_long,int,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::ListSearchSimpleOp<unsigned_long,true>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::list_entry_t_const&,unsigned_long_const&,duckdb::ValidityMask&,unsigned_long)_1_>
            (list_vec,target_vec,result,count,fun);
  iVar1 = local_a0;
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar1;
}

Assistant:

idx_t ListSearchSimpleOp(Vector &list_vec, Vector &source_vec, Vector &target_vec, Vector &result, idx_t count) {

	UnifiedVectorFormat source_format;
	const auto source_count = ListVector::GetListSize(list_vec);
	source_vec.ToUnifiedFormat(source_count, source_format);
	const auto source_data = UnifiedVectorFormat::GetData<T>(source_format);

	using RETURN_TYPE = typename std::conditional<RETURN_POSITION, int32_t, int8_t>::type;

	idx_t total_matches = 0;

	BinaryExecutor::ExecuteWithNulls<list_entry_t, T, RETURN_TYPE>(
	    list_vec, target_vec, result, count,
	    [&](const list_entry_t &list, const T &target, ValidityMask &validity, idx_t out_idx) -> RETURN_TYPE {
		    if (list.length == 0) {
			    if (RETURN_POSITION) {
				    validity.SetInvalid(out_idx);
			    }
			    return 0;
		    }

		    for (auto i = list.offset; i < list.offset + list.length; i++) {
			    const auto entry_idx = source_format.sel->get_index(i);
			    if (source_format.validity.RowIsValid(entry_idx) &&
			        Equals::Operation<T>(source_data[entry_idx], target)) {
				    total_matches++;
				    return RETURN_POSITION ? UnsafeNumericCast<RETURN_TYPE>(1 + i - list.offset) : 1;
			    }
		    }

		    if (RETURN_POSITION) {
			    validity.SetInvalid(out_idx);
		    }
		    return 0;
	    });

	return total_matches;
}